

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg.cpp
# Opt level: O1

bool mg::data::mrg_read(string *hed,string *mrg,Mrg *out)

{
  int iVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  pointer local_48;
  string *local_40;
  ulong local_38;
  
  uVar3 = hed->_M_string_length;
  local_40 = mrg;
  local_38 = uVar3;
  if ((uVar3 & 7) == 0) {
    local_48 = (hed->_M_dataplus)._M_p;
    std::vector<mg::data::Mrg::Entry,_std::allocator<mg::data::Mrg::Entry>_>::_M_erase_at_end
              (&out->entries,*(pointer *)out);
    if (uVar3 != 0) {
      uVar4 = local_38 >> 3;
      uVar3 = 0;
      do {
        iVar1 = (int)*(ulong *)(local_48 + uVar3 * 8);
        if (iVar1 == -1) break;
        pcVar2 = (local_40->_M_dataplus)._M_p + (uint)(iVar1 << 0xb);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,pcVar2,
                   pcVar2 + ((uint)(*(ulong *)(local_48 + uVar3 * 8) >> 0x15) & 0x7fff800));
        std::vector<mg::data::Mrg::Entry,std::allocator<mg::data::Mrg::Entry>>::
        emplace_back<std::__cxx11::string>
                  ((vector<mg::data::Mrg::Entry,std::allocator<mg::data::Mrg::Entry>> *)out,
                   &local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
  }
  else {
    mrg_read();
  }
  return (local_38 & 7) == 0;
}

Assistant:

bool mrg_read(const std::string &hed, const std::string &mrg, Mrg &out) {
  if (hed.size() % sizeof(Mrg::PackedEntryHeader) != 0) {
    fprintf(stderr, "Wrong size for HED, must be multiple of %lu\n",
            sizeof(Mrg::PackedEntryHeader));
    return false;
  }

  // Reinterpret header
  const ssize_t entry_count = hed.size() / sizeof(Mrg::PackedEntryHeader);
  const Mrg::PackedEntryHeader *raw_entries =
      reinterpret_cast<const Mrg::PackedEntryHeader *>(hed.data());

  // Parse off each entry
  out.entries.clear();
  for (ssize_t i = 0; i < entry_count; i++) {
    // Copy current header
    Mrg::PackedEntryHeader header = raw_entries[i];

    // Endian swap to host
    header.to_host_order();

    // Is this EOF?
    if (header.offset == 0xFFFF'FFFF) {
      break;
    }

    // Excise the source data at the specified offset + len
    out.entries.emplace_back(
        std::string(&mrg[header.offset * Mrg::SECTOR_SIZE],
                    header.size_sectors * Mrg::SECTOR_SIZE));
  }

  return true;
}